

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::fetchSampleValue
          (ImageSampleInstanceImages *this,int samplePosNdx)

{
  VkImageViewType baseArraySlice;
  uint uVar1;
  int iVar2;
  VkImageViewType *pVVar3;
  long lVar4;
  uint in_EDX;
  deUint32 level;
  VkImageViewType baseMipLevel;
  undefined4 in_register_00000034;
  VkImageViewType *pVVar5;
  VkImageViewType *pVVar6;
  VkImageViewType VVar7;
  long lVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float fVar10;
  float extraout_XMM0_Db;
  Vec4 VVar12;
  Vec4 samplePos;
  ConstPixelBufferAccess wholeLevel;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> levelStorage;
  WrapMode local_68;
  ConstPixelBufferAccess local_58;
  undefined8 uVar11;
  
  pVVar5 = (VkImageViewType *)CONCAT44(in_register_00000034,samplePosNdx);
  pVVar6 = pVVar5 + 6;
  if (pVVar5[0x4a] != VK_IMAGE_VIEW_TYPE_1D) {
    pVVar3 = pVVar5 + 0x14;
    if (pVVar5[0x4b] == VK_IMAGE_VIEW_TYPE_1D) {
      pVVar3 = pVVar6;
    }
    if ((in_EDX & 1) != 0) {
      pVVar6 = pVVar3;
    }
  }
  lVar8 = 0x170;
  if (pVVar5[0x4b] == VK_IMAGE_VIEW_TYPE_1D) {
    lVar8 = 0x134;
  }
  if ((in_EDX & 1) == 0) {
    lVar8 = 0x134;
  }
  VVar7 = *pVVar5;
  baseMipLevel = pVVar5[1];
  baseArraySlice = pVVar5[2];
  VVar12 = getSamplePos((ImageSampleInstanceImages *)&samplePos,VVar7,baseMipLevel,baseArraySlice,
                        in_EDX);
  uVar11 = VVar12.m_data._8_8_;
  fVar9 = 0.0;
  fVar10 = 0.0;
  levelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  levelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  levelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (VVar7 < VK_IMAGE_VIEW_TYPE_LAST) {
    switch(VVar7) {
    default:
      VVar7 = (int)((ulong)(*(undefined8 *)(pVVar6 + 10) - *(undefined8 *)(pVVar6 + 8)) >> 3) *
              -0x33333333;
      if (baseMipLevel < VVar7) {
        iVar2 = *(int *)(*(undefined8 *)(pVVar6 + 8) + 0xc);
        do {
          lVar8 = *(undefined8 *)(pVVar6 + 8) + (long)(int)baseMipLevel * 0x28;
          wholeLevel.m_format =
               *(TextureFormat *)(*(undefined8 *)(pVVar6 + 8) + (long)(int)baseMipLevel * 0x28);
          lVar4 = 2;
          do {
            wholeLevel.m_size.m_data[lVar4 + -2] = *(int *)(lVar8 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 5);
          lVar4 = 5;
          do {
            wholeLevel.m_size.m_data[lVar4 + -2] = *(int *)(lVar8 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          wholeLevel.m_data = *(void **)(lVar8 + 0x20);
          tcu::getSubregion(&local_58,&wholeLevel,0,baseArraySlice,wholeLevel.m_size.m_data[0],
                            iVar2 - baseArraySlice);
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(&levelStorage,&local_58);
          baseMipLevel = baseMipLevel + VK_IMAGE_VIEW_TYPE_2D;
        } while (baseMipLevel != VVar7);
      }
      tcu::Texture1DArrayView::Texture1DArrayView
                ((Texture1DArrayView *)&wholeLevel,
                 (int)((ulong)((long)levelStorage.
                                     super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)levelStorage.
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
                 levelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_68 = wholeLevel.m_format.order;
      VVar12 = tcu::Texture1DArrayView::sample
                         ((Texture1DArrayView *)this,(Sampler *)&local_68,samplePos.m_data[0],
                          samplePos.m_data[1],0.0);
      uVar11 = VVar12.m_data._8_8_;
      fVar9 = VVar12.m_data[0];
      fVar10 = VVar12.m_data[1];
      break;
    case VK_IMAGE_VIEW_TYPE_2D:
    case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
      VVar7 = (int)((ulong)(*(undefined8 *)(pVVar6 + 10) - *(undefined8 *)(pVVar6 + 8)) >> 3) *
              -0x33333333;
      if (baseMipLevel < VVar7) {
        iVar2 = *(int *)(*(undefined8 *)(pVVar6 + 8) + 0x10);
        do {
          lVar8 = *(undefined8 *)(pVVar6 + 8) + (long)(int)baseMipLevel * 0x28;
          wholeLevel.m_format =
               *(TextureFormat *)(*(undefined8 *)(pVVar6 + 8) + (long)(int)baseMipLevel * 0x28);
          lVar4 = 2;
          do {
            wholeLevel.m_size.m_data[lVar4 + -2] = *(int *)(lVar8 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 5);
          lVar4 = 5;
          do {
            wholeLevel.m_size.m_data[lVar4 + -2] = *(int *)(lVar8 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          wholeLevel.m_data = *(void **)(lVar8 + 0x20);
          tcu::getSubregion(&local_58,&wholeLevel,0,0,baseArraySlice,wholeLevel.m_size.m_data[0],
                            wholeLevel.m_size.m_data[1],iVar2 - baseArraySlice);
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(&levelStorage,&local_58);
          baseMipLevel = baseMipLevel + VK_IMAGE_VIEW_TYPE_2D;
        } while (baseMipLevel != VVar7);
      }
      tcu::Texture2DArrayView::Texture2DArrayView
                ((Texture2DArrayView *)&wholeLevel,
                 (int)((ulong)((long)levelStorage.
                                     super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)levelStorage.
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
                 levelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_68 = wholeLevel.m_format.order;
      VVar12 = tcu::Texture2DArrayView::sample
                         ((Texture2DArrayView *)this,(Sampler *)&local_68,samplePos.m_data[0],
                          samplePos.m_data[1],samplePos.m_data[2],0.0);
      uVar11 = VVar12.m_data._8_8_;
      fVar9 = VVar12.m_data[0];
      fVar10 = VVar12.m_data[1];
      break;
    case VK_IMAGE_VIEW_TYPE_3D:
      VVar7 = (int)((ulong)(*(undefined8 *)(pVVar6 + 10) - *(undefined8 *)(pVVar6 + 8)) >> 3) *
              -0x33333333;
      if (baseMipLevel < VVar7) {
        do {
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(&levelStorage,
                    (value_type *)((long)(int)baseMipLevel * 0x28 + *(undefined8 *)(pVVar6 + 8)));
          baseMipLevel = baseMipLevel + VK_IMAGE_VIEW_TYPE_2D;
        } while (VVar7 != baseMipLevel);
      }
      tcu::Texture3DView::Texture3DView
                ((Texture3DView *)&wholeLevel,
                 (int)((ulong)((long)levelStorage.
                                     super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)levelStorage.
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
                 levelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      VVar12 = tcu::sampleLevelArray3D
                         ((tcu *)this,
                          (ConstPixelBufferAccess *)
                          CONCAT44(wholeLevel.m_size.m_data[1],wholeLevel.m_size.m_data[0]),
                          wholeLevel.m_format.order,(Sampler *)((long)pVVar5 + lVar8),
                          samplePos.m_data[0],samplePos.m_data[1],samplePos.m_data[2],0.0);
      uVar11 = VVar12.m_data._8_8_;
      fVar9 = VVar12.m_data[0];
      fVar10 = VVar12.m_data[1];
      break;
    case VK_IMAGE_VIEW_TYPE_CUBE:
    case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
      VVar7 = (int)((ulong)(*(undefined8 *)(pVVar6 + 10) - *(undefined8 *)(pVVar6 + 8)) >> 3) *
              -0x33333333;
      if (baseMipLevel < VVar7) {
        uVar1 = *(uint *)(*(undefined8 *)(pVVar6 + 8) + 0x10);
        do {
          lVar8 = *(undefined8 *)(pVVar6 + 8) + (long)(int)baseMipLevel * 0x28;
          wholeLevel.m_format =
               *(TextureFormat *)(*(undefined8 *)(pVVar6 + 8) + (long)(int)baseMipLevel * 0x28);
          lVar4 = 2;
          do {
            wholeLevel.m_size.m_data[lVar4 + -2] = *(int *)(lVar8 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 5);
          lVar4 = 5;
          do {
            wholeLevel.m_size.m_data[lVar4 + -2] = *(int *)(lVar8 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          wholeLevel.m_data = *(void **)(lVar8 + 0x20);
          tcu::getSubregion(&local_58,&wholeLevel,0,0,baseArraySlice * 6,wholeLevel.m_size.m_data[0]
                            ,wholeLevel.m_size.m_data[1],(uVar1 / 6 - baseArraySlice) * 6);
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(&levelStorage,&local_58);
          baseMipLevel = baseMipLevel + VK_IMAGE_VIEW_TYPE_2D;
        } while (baseMipLevel != VVar7);
      }
      tcu::TextureCubeArrayView::TextureCubeArrayView
                ((TextureCubeArrayView *)&wholeLevel,
                 (int)((ulong)((long)levelStorage.
                                     super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)levelStorage.
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
                 levelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      local_68 = wholeLevel.m_format.order;
      VVar12 = tcu::TextureCubeArrayView::sample
                         ((TextureCubeArrayView *)this,(Sampler *)&local_68,samplePos.m_data[0],
                          samplePos.m_data[1],samplePos.m_data[2],samplePos.m_data[3],0.0);
      uVar11 = VVar12.m_data._8_8_;
      fVar9 = VVar12.m_data[0];
      fVar10 = VVar12.m_data[1];
    }
  }
  else {
    (this->super_ImageInstanceImages).m_viewType = VK_IMAGE_VIEW_TYPE_1D;
    (this->super_ImageInstanceImages).m_baseMipLevel = 0;
    (this->super_ImageInstanceImages).m_baseArraySlice = 0;
    (this->super_ImageInstanceImages).m_imageFormat.order = R;
  }
  if (levelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(levelStorage.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)levelStorage.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)levelStorage.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    fVar9 = extraout_XMM0_Da;
    fVar10 = extraout_XMM0_Db;
  }
  VVar12.m_data[1] = fVar10;
  VVar12.m_data[0] = fVar9;
  VVar12.m_data[2] = (float)(int)uVar11;
  VVar12.m_data[3] = (float)(int)((ulong)uVar11 >> 0x20);
  return (Vec4)VVar12.m_data;
}

Assistant:

tcu::Vec4 ImageSampleInstanceImages::fetchSampleValue (int samplePosNdx) const
{
	DE_ASSERT(de::inBounds(samplePosNdx, 0, 4));

	// texture order is ABAB
	const bool									isSamplerCase	= (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER);
	const tcu::TextureLevelPyramid&				sampleSrcA		= m_sourceImageA;
	const tcu::TextureLevelPyramid&				sampleSrcB		= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? (m_sourceImageA) : (m_sourceImageB);
	const tcu::TextureLevelPyramid&				sampleSrc		= (isSamplerCase) ? (sampleSrcA) : ((samplePosNdx % 2) == 0) ? (sampleSrcA) : (sampleSrcB);

	// sampler order is ABAB
	const tcu::Sampler&							samplerA		= m_refSamplerA;
	const tcu::Sampler&							samplerB		= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? (m_refSamplerA) : (m_refSamplerB);
	const tcu::Sampler&							sampler			= ((samplePosNdx % 2) == 0) ? (samplerA) : (samplerB);

	const tcu::Vec4								samplePos		= getSamplePos(m_viewType, m_baseMipLevel, m_baseArraySlice, samplePosNdx);
	const float									lod				= 0.0f;
	std::vector<tcu::ConstPixelBufferAccess>	levelStorage;

	switch (m_viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:	return getRef1DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_2D:
		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:	return getRef2DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_3D:			return getRef3DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:	return getRefCubeView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), samplePos.w(), lod);

		default:
		{
			DE_FATAL("Impossible");
			return tcu::Vec4();
		}
	}
}